

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O0

void __thiscall
optimization::loop_unrolling::Loop_Unrolling::optimize_func(Loop_Unrolling *this,MirFunction *func)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  size_t sVar4;
  loop_info *this_00;
  pointer pIVar5;
  loop_info *in_RSI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3;
  int times;
  mapped_type *blk;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> vars;
  int size;
  optional<optimization::loop_unrolling::loop_info> info;
  BasicBlk *startblk;
  pair<const_int,_mir::inst::BasicBlk> *blkpair;
  iterator __end2;
  iterator __begin2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> base_blks;
  loop_info *in_stack_00000d10;
  BasicBlk *in_stack_00000d18;
  MirFunction *in_stack_00000d20;
  loop_info *in_stack_fffffffffffffd98;
  loop_info *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  MirFunction *in_stack_fffffffffffffdc0;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffe40;
  pair<mir::inst::Op,_int> in_stack_fffffffffffffe48;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_180;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_178;
  int local_16c;
  mapped_type *local_168;
  int local_12c;
  _Base_ptr local_90;
  BasicBlk *local_88;
  _Base_ptr local_80;
  undefined1 local_78;
  reference local_60;
  _Self local_58;
  _Self local_50;
  MirFunction **local_48;
  loop_info *local_10;
  
  local_10 = in_RSI;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ece34);
  local_48 = &local_10[1].func;
  local_50._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffd98);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              *)in_stack_fffffffffffffd98);
  while (bVar1 = std::operator!=(&local_50,&local_58), bVar1) {
    local_60 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1ece9a)
    ;
    pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
                       (value_type_conflict3 *)
                       CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    local_80 = (_Base_ptr)pVar6.first._M_node;
    local_78 = pVar6.second;
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_fffffffffffffda0);
  }
  local_90 = (_Base_ptr)
             std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      *)in_stack_fffffffffffffd98);
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1ecf28);
  local_88 = &ppVar3->second;
  while( true ) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffda0,
               (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd98);
    find_loop_start((MirFunction *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ecf83);
    bVar1 = std::optional<optimization::loop_unrolling::loop_info>::has_value
                      ((optional<optimization::loop_unrolling::loop_info> *)0x1ecf90);
    if (!bVar1) break;
    sVar4 = mir::inst::MirFunction::variable_table_size(in_stack_fffffffffffffdc0);
    local_12c = (int)sVar4;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1ecfec);
    std::optional<optimization::loop_unrolling::loop_info>::operator->
              ((optional<optimization::loop_unrolling::loop_info> *)0x1ed00a);
    std::
    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
    ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
          *)in_stack_fffffffffffffdc0,
         (key_type *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    local_168 = std::
                map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      *)in_stack_fffffffffffffdc0,
                     (key_type *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    this_00 = std::optional<optimization::loop_unrolling::loop_info>::operator->
                        ((optional<optimization::loop_unrolling::loop_info> *)0x1ed056);
    local_16c = loop_info::get_times(this_00);
    local_178 = &local_168->inst;
    local_180._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_fffffffffffffd98);
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *)in_stack_fffffffffffffd98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffda0,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffd98), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator*(&local_180);
      pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x1ed0ed);
      iVar2 = (*(pIVar5->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 != 7) {
        in_stack_fffffffffffffdc0 = (MirFunction *)&local_10->change;
        in_stack_fffffffffffffdbc = local_16c;
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1ed15c);
        std::
        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
        ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              *)in_stack_fffffffffffffdc0,
             (key_type_conflict *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        in_stack_fffffffffffffdb8 = mir::inst::Variable::size((Variable *)in_stack_fffffffffffffda0)
        ;
        local_12c = in_stack_fffffffffffffdbc * in_stack_fffffffffffffdb8 + local_12c;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_180);
    }
    in_stack_fffffffffffffda0 = local_10;
    std::optional<optimization::loop_unrolling::loop_info>::value
              ((optional<optimization::loop_unrolling::loop_info> *)local_10);
    in_stack_fffffffffffffd98 = (loop_info *)&stack0xfffffffffffffe10;
    loop_info::loop_info(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    expand_loop(in_stack_00000d20,in_stack_00000d18,in_stack_00000d10);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1ed212);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ed224);
  return;
}

Assistant:

void Loop_Unrolling::optimize_func(mir::inst::MirFunction& func) {
  std::set<mir::types::LabelId> base_blks;
  for (auto& blkpair : func.basic_blks) {
    base_blks.insert(blkpair.first);
  }
  auto& startblk = func.basic_blks.begin()->second;
  while (true) {
    auto info = find_loop_start(func, base_blks);
    if (!info.has_value()) {
      break;
    }
    int size = func.variable_table_size();
    std::set<mir::inst::VarId> vars;
    auto& blk =
        func.basic_blks.at(func.basic_blks.at(info->loop_start).jump.bb_true);

    int times = info->get_times();
    for (auto& inst : blk.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Phi) {
        continue;
      }
      size += times * func.variables.at(inst->dest.id).size();
    }

    // if (size >= 1024) {
    //   return;
    // }
    expand_loop(func, blk, info.value());
  }
}